

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCall type;
  TEST_MockExpectedCall_getParameterValueOfObjectTypeWithoutComparator_Test *this_local;
  
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&repository.head_,1);
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_30);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_30);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(local_50,"type");
  SimpleString::SimpleString(&local_60,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar1,local_50,&local_60,&repository.head_);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(local_50);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_80,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_70,pMVar1,&local_80);
  pcVar3 = SimpleString::asCharString(&local_70);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"No comparator found for type: \"type\"",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x19f,pTVar4);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_30);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&repository.head_);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectTypeWithoutComparator)
{
    TypeForTestingExpectedFunctionCall type(1);
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    call->withParameterOfType("type", "name", &type);
    STRCMP_EQUAL("No comparator found for type: \"type\"", call->getInputParameterValueString("name").asCharString());
}